

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
mxx::scatter<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
                 vector<int,_std::allocator<int>_> *msgs,size_t size,int root,comm *comm)

{
  undefined8 in_RAX;
  pointer msgs_00;
  int rank;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  msgs_00 = (msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if ((comm->m_rank == root) &&
     ((long)(msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish - (long)msgs_00 >> 2 != (long)comm->m_size * size)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_34);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_34,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
           ,0x96,"scatter","comm.rank() != root || msgs.size() == size*comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    msgs_00 = (msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
  }
  scatter<int>(__return_storage_ptr__,msgs_00,size,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter(const std::vector<T>& msgs, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(comm.rank() != root || msgs.size() == size*comm.size());
    std::vector<T> result = scatter(&msgs[0], size, root, comm);
    return result;
}